

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseName(htmlParserCtxtPtr ctxt)

{
  int len;
  xmlChar *pxVar1;
  bool bVar2;
  int count;
  xmlChar *ret;
  xmlChar *in;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserInputGrow(ctxt->input,0xfa);
  }
  ret = ctxt->input->cur;
  if ((((0x60 < *ret) && (*ret < 0x7b)) || ((0x40 < *ret && (*ret < 0x5b)))) ||
     ((*ret == 0x5f || (*ret == 0x3a)))) {
    do {
      ret = ret + 1;
      if (((*ret < 0x61) || (bVar2 = true, 0x7a < *ret)) &&
         ((((*ret < 0x41 || (bVar2 = true, 0x5a < *ret)) &&
           ((*ret < 0x30 || (bVar2 = true, 0x39 < *ret)))) &&
          (((bVar2 = true, *ret != '_' && (bVar2 = true, *ret != '-')) &&
           (bVar2 = true, *ret != ':')))))) {
        bVar2 = *ret == '.';
      }
    } while (bVar2);
    if (ret == ctxt->input->end) {
      return (xmlChar *)0x0;
    }
    if ((*ret != '\0') && (*ret < 0x80)) {
      len = (int)ret - (int)ctxt->input->cur;
      pxVar1 = xmlDictLookup(ctxt->dict,ctxt->input->cur,len);
      ctxt->input->cur = ret;
      ctxt->input->col = len + ctxt->input->col;
      return pxVar1;
    }
  }
  pxVar1 = htmlParseNameComplex(ctxt);
  return pxVar1;
}

Assistant:

static const xmlChar *
htmlParseName(htmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    int count = 0;

    GROW;

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;

	if (in == ctxt->input->end)
	    return(NULL);

	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    return(ret);
	}
    }
    return(htmlParseNameComplex(ctxt));
}